

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile_common.c
# Opt level: O2

void av1_calculate_tile_rows(SequenceHeader *seq_params,int cm_mi_rows,CommonTileParams *tiles)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  
  bVar1 = (byte)seq_params->mib_size_log2;
  iVar3 = (1 << (bVar1 & 0x1f)) + cm_mi_rows + -1 >> (bVar1 & 0x1f);
  if (tiles->uniform_spacing == 0) {
    iVar3 = tile_log2(1,tiles->rows);
    tiles->log2_rows = iVar3;
  }
  else {
    bVar1 = (byte)tiles->log2_rows;
    bVar2 = bVar1 & 0x1f;
    iVar5 = iVar3 + (1 << bVar2) + -1 >> (bVar1 & 0x1f);
    uVar4 = 0;
    for (iVar6 = 0 << bVar2; iVar6 < iVar3; iVar6 = iVar6 + iVar5) {
      tiles->row_start_sb[uVar4] = iVar6;
      uVar4 = uVar4 + 1;
    }
    tiles->rows = (int)uVar4;
    tiles->row_start_sb[uVar4 & 0xffffffff] = iVar3;
    iVar5 = iVar5 << ((byte)seq_params->mib_size_log2 & 0x1f);
    if (cm_mi_rows <= iVar5) {
      iVar5 = cm_mi_rows;
    }
    tiles->height = iVar5;
  }
  return;
}

Assistant:

void av1_calculate_tile_rows(const SequenceHeader *const seq_params,
                             int cm_mi_rows, CommonTileParams *const tiles) {
  int sb_rows = CEIL_POWER_OF_TWO(cm_mi_rows, seq_params->mib_size_log2);
  int start_sb, size_sb, i;

  if (tiles->uniform_spacing) {
    size_sb = CEIL_POWER_OF_TWO(sb_rows, tiles->log2_rows);
    assert(size_sb > 0);
    for (i = 0, start_sb = 0; start_sb < sb_rows; i++) {
      tiles->row_start_sb[i] = start_sb;
      start_sb += size_sb;
    }
    tiles->rows = i;
    tiles->row_start_sb[i] = sb_rows;

    tiles->height = size_sb << seq_params->mib_size_log2;
    tiles->height = AOMMIN(tiles->height, cm_mi_rows);
  } else {
    tiles->log2_rows = tile_log2(1, tiles->rows);
  }
}